

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::CommandLineInterface::ParseArgument
          (CommandLineInterface *this,char *arg,string *name,string *value)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  undefined2 *local_50;
  undefined8 local_48;
  undefined2 local_40;
  undefined1 uStack_3e;
  undefined5 uStack_3d;
  
  if ((*arg == '-') && (arg[1] != '\0')) {
    if (arg[1] == '-') {
      pcVar2 = strchr(arg,0x3d);
      if (pcVar2 != (char *)0x0) {
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,arg,pcVar2);
        std::__cxx11::string::operator=((string *)name,(string *)&local_50);
        if (local_50 != &local_40) {
          operator_delete(local_50,CONCAT53(uStack_3d,CONCAT12(uStack_3e,local_40)) + 1);
        }
        arg = pcVar2 + 1;
        pcVar2 = (char *)value->_M_string_length;
        strlen(arg);
        goto LAB_0018f7bd;
      }
      pcVar2 = (char *)name->_M_string_length;
      strlen(arg);
      std::__cxx11::string::_M_replace((ulong)name,0,pcVar2,(ulong)arg);
    }
    else {
      local_40 = *(undefined2 *)arg;
      local_48 = 2;
      uStack_3e = 0;
      local_50 = &local_40;
      std::__cxx11::string::operator=((string *)name,(string *)&local_50);
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT53(uStack_3d,CONCAT12(uStack_3e,local_40)) + 1);
      }
      pcVar2 = (char *)value->_M_string_length;
      strlen(arg + 2);
      std::__cxx11::string::_M_replace((ulong)value,0,pcVar2,(ulong)(arg + 2));
      if (value->_M_string_length != 0) {
        return false;
      }
    }
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (((((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)name), iVar1 == 0)) ||
         (iVar1 = std::__cxx11::string::compare((char *)name), iVar1 == 0)) ||
        (((iVar1 = std::__cxx11::string::compare((char *)name), iVar1 == 0 ||
          (iVar1 = std::__cxx11::string::compare((char *)name), iVar1 == 0)) ||
         ((iVar1 = std::__cxx11::string::compare((char *)name), iVar1 == 0 ||
          ((iVar1 = std::__cxx11::string::compare((char *)name), iVar1 == 0 ||
           (iVar1 = std::__cxx11::string::compare((char *)name), iVar1 == 0)))))))) ||
       ((iVar1 = std::__cxx11::string::compare((char *)name), iVar1 == 0 ||
        ((((iVar1 = std::__cxx11::string::compare((char *)name), iVar1 == 0 ||
           (iVar1 = std::__cxx11::string::compare((char *)name), iVar1 == 0)) ||
          (iVar1 = std::__cxx11::string::compare((char *)name), iVar1 == 0)) ||
         (iVar1 = std::__cxx11::string::compare((char *)name), iVar1 == 0)))))) {
      bVar3 = false;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)name);
      bVar3 = iVar1 != 0;
    }
  }
  else {
    name->_M_string_length = 0;
    *(name->_M_dataplus)._M_p = '\0';
    pcVar2 = (char *)value->_M_string_length;
    strlen(arg);
LAB_0018f7bd:
    bVar3 = false;
    std::__cxx11::string::_M_replace((ulong)value,0,pcVar2,(ulong)arg);
  }
  return bVar3;
}

Assistant:

bool CommandLineInterface::ParseArgument(const char* arg, std::string* name,
                                         std::string* value) {
  bool parsed_value = false;

  if (arg[0] != '-') {
    // Not a flag.
    name->clear();
    parsed_value = true;
    *value = arg;
  } else if (arg[1] == '-') {
    // Two dashes:  Multi-character name, with '=' separating name and
    //   value.
    const char* equals_pos = strchr(arg, '=');
    if (equals_pos != nullptr) {
      *name = std::string(arg, equals_pos - arg);
      *value = equals_pos + 1;
      parsed_value = true;
    } else {
      *name = arg;
    }
  } else {
    // One dash:  One-character name, all subsequent characters are the
    //   value.
    if (arg[1] == '\0') {
      // arg is just "-".  We treat this as an input file, except that at
      // present this will just lead to a "file not found" error.
      name->clear();
      *value = arg;
      parsed_value = true;
    } else {
      *name = std::string(arg, 2);
      *value = arg + 2;
      parsed_value = !value->empty();
    }
  }

  // Need to return true iff the next arg should be used as the value for this
  // one, false otherwise.

  if (parsed_value) {
    // We already parsed a value for this flag.
    return false;
  }

  if (*name == "-h" || *name == "--help" || *name == "--disallow_services" ||
      *name == "--include_imports" || *name == "--include_source_info" ||
      *name == "--retain_options" || *name == "--version" ||
      *name == "--decode_raw" ||
      *name == "--notices" ||
      *name == "--experimental_editions" ||
      *name == "--print_free_field_numbers" ||
      *name == "--experimental_allow_proto3_optional" ||
      *name == "--deterministic_output" || *name == "--fatal_warnings") {
    // HACK:  These are the only flags that don't take a value.
    //   They probably should not be hard-coded like this but for now it's
    //   not worth doing better.
    return false;
  }

  // Next argument is the flag value.
  return true;
}